

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O3

int pageant_listen_accepting(Plug *plug,accept_fn_t constructor,accept_ctx_t ctx)

{
  PlugVtable *pPVar1;
  long lVar2;
  undefined8 *ptr;
  Socket *pSVar3;
  char *pcVar4;
  SocketPeerInfo *pi;
  undefined8 *puVar5;
  int iVar6;
  
  ptr = (undefined8 *)safemalloc(1,0x40080,0);
  ptr[0x800f] = &pageant_connection_plugvt;
  ptr[0x800c] = &pageant_connection_clientvt;
  ptr[1] = plug[-2].vt;
  ptr[0x8008] = ptr + 0x8007;
  ptr[0x8007] = ptr + 0x8007;
  pPVar1 = plug[-1].vt;
  plug[-1].vt = (PlugVtable *)((long)&pPVar1->log + 1);
  ptr[0x8004] = pPVar1;
  ptr[0x8005] = 0;
  *(undefined4 *)(ptr + 0x8006) = 0;
  pSVar3 = (*constructor)((accept_ctx_t)ctx.p,(Plug *)(ptr + 0x800f));
  *ptr = pSVar3;
  pcVar4 = (*pSVar3->vt->socket_error)(pSVar3);
  lVar2 = *(long *)*ptr;
  if (pcVar4 == (char *)0x0) {
    (**(code **)(lVar2 + 0x28))((long *)*ptr,0);
    pi = (SocketPeerInfo *)(**(code **)(*(long *)*ptr + 0x38))();
    if ((pi == (SocketPeerInfo *)0x0) || (pi->log_text == (char *)0x0)) {
      pageant_listener_client_log
                ((PageantListenerClient *)plug[-2].vt,"c#%zu: new connection",ptr[0x8004]);
    }
    else {
      pageant_listener_client_log
                ((PageantListenerClient *)plug[-2].vt,"c#%zu: new connection from %s",ptr[0x8004]);
    }
    sk_free_peer_info(pi);
    iVar6 = 0;
    puVar5 = (undefined8 *)safemalloc(1,0x18,0);
    ptr[0x800d] = puVar5;
    *puVar5 = ptr + 0x800c;
    puVar5[2] = puVar5 + 1;
    puVar5[1] = puVar5 + 1;
  }
  else {
    (**(code **)(lVar2 + 8))();
    safefree(ptr);
    iVar6 = 1;
  }
  return iVar6;
}

Assistant:

static int pageant_listen_accepting(Plug *plug,
                                    accept_fn_t constructor, accept_ctx_t ctx)
{
    struct pageant_listen_state *pl = container_of(
        plug, struct pageant_listen_state, plug);
    struct pageant_conn_state *pc;
    const char *err;
    SocketPeerInfo *peerinfo;

    pc = snew(struct pageant_conn_state);
    pc->plug.vt = &pageant_connection_plugvt;
    pc->pc.vt = &pageant_connection_clientvt;
    pc->plc = pl->plc;
    pc->response_queue.next = pc->response_queue.prev = &pc->response_queue;
    pc->conn_index = pl->conn_index++;
    pc->req_index = 0;
    pc->crLine = 0;

    pc->connsock = constructor(ctx, &pc->plug);
    if ((err = sk_socket_error(pc->connsock)) != NULL) {
        sk_close(pc->connsock);
        sfree(pc);
        return 1;
    }

    sk_set_frozen(pc->connsock, false);

    peerinfo = sk_peer_info(pc->connsock);
    if (peerinfo && peerinfo->log_text) {
        pageant_listener_client_log(pl->plc,
                                    "c#%"SIZEu": new connection from %s",
                                    pc->conn_index, peerinfo->log_text);
    } else {
        pageant_listener_client_log(pl->plc, "c#%"SIZEu": new connection",
                                    pc->conn_index);
    }
    sk_free_peer_info(peerinfo);

    pageant_register_client(&pc->pc);

    return 0;
}